

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void store_perfprof_run(PerfTbl *tbl,PerfProfInputUniqueId *uid,PerfProfRun *run)

{
  uint uVar1;
  double dVar2;
  int iVar3;
  PerfTblEntry *pPVar4;
  long lVar5;
  ulong uVar6;
  uint8_t *puVar7;
  PerfProfRun *__s2;
  PerfProfRun *pPVar8;
  byte bVar9;
  uint8_t auStack_138 [66];
  undefined1 local_f6 [66];
  undefined1 local_b4 [66];
  undefined1 local_72 [66];
  
  bVar9 = 0;
  printf("Inserting run into table. Instance hash: %d:%s. Run ::: solver_name = %s, time = %.17g, closedProblem = %d, obj_ub = %.17g\n"
         ,(run->solution).stats[0],(run->solution).stats[1],(ulong)uid->seedidx,&uid->hash,run);
  memcpy(auStack_138,uid,0x42);
  pPVar4 = tbl->buf;
  memcpy(local_72,uid,0x42);
  pPVar4 = (PerfTblEntry *)stbds_hmget_key(pPVar4,0x2d0,local_72,0x42,0);
  tbl->buf = pPVar4;
  if ((pPVar4 == (PerfTblEntry *)0x0) || (pPVar4[-2].value.runs[7].solution.stats[2] == -NAN)) {
    memcpy(local_b4,auStack_138,0x42);
    pPVar4 = (PerfTblEntry *)stbds_hmput_key(pPVar4,0x2d0,local_b4,0x42,0);
    tbl->buf = pPVar4;
    puVar7 = auStack_138;
    pPVar4 = pPVar4 + (long)pPVar4[-2].value.runs[7].solution.stats[2];
    for (lVar5 = 0x42; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pPVar4->key).uid.seedidx = *puVar7;
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      pPVar4 = (PerfTblEntry *)((long)pPVar4 + (ulong)bVar9 * -2 + 1);
    }
    memset(&tbl->buf[(long)tbl->buf[-2].value.runs[7].solution.stats[2]].value,0,0x288);
    pPVar4 = tbl->buf;
  }
  memcpy(local_f6,auStack_138,0x42);
  uVar6 = 0;
  pPVar4 = (PerfTblEntry *)stbds_hmget_key(pPVar4,0x2d0,local_f6,0x42,0);
  tbl->buf = pPVar4;
  dVar2 = pPVar4[-2].value.runs[7].solution.stats[2];
  uVar1 = pPVar4[(long)dVar2].value.num_runs;
  pPVar8 = pPVar4[(long)dVar2].value.runs;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  lVar5 = uVar6 + 1;
  __s2 = pPVar8;
  do {
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      if (uVar1 < 8) {
        pPVar4[(long)dVar2].value.num_runs = uVar1 + 1;
        pPVar8 = pPVar8 + uVar1;
        for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(undefined8 *)pPVar8->solver_name = *(undefined8 *)run->solver_name;
          run = (PerfProfRun *)((long)run + (ulong)bVar9 * -0x10 + 8);
          pPVar8 = (PerfProfRun *)((long)pPVar8 + (ulong)bVar9 * -0x10 + 8);
        }
        return;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
                    ,0x80,
                    "void store_perfprof_run(PerfTbl *, PerfProfInputUniqueId *, PerfProfRun *)");
    }
    iVar3 = strcmp(run->solver_name,__s2->solver_name);
    __s2 = __s2 + 1;
  } while (iVar3 != 0);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
                ,0x78,"void store_perfprof_run(PerfTbl *, PerfProfInputUniqueId *, PerfProfRun *)");
}

Assistant:

void store_perfprof_run(PerfTbl *tbl, PerfProfInputUniqueId *uid,
                        PerfProfRun *run) {
    printf("Inserting run into table. Instance hash: %d:%s. Run ::: "
           "solver_name = %s, "
           "time = %.17g, closedProblem = %d, obj_ub "
           "= %.17g\n",
           uid->seedidx, uid->hash.cstr, run->solver_name,
           run->solution.stats[PERFPROF_STAT_KIND_TIME],
           BOOL(run->solution.status & SOLVE_STATUS_CLOSED_PROBLEM),
           run->solution.stats[PERFPROF_STAT_KIND_PRIMAL_BOUND]);

    PerfTblKey key = {0};
    memcpy(&key.uid, uid, sizeof(key.uid));

    if (!hmgetp_null(tbl->buf, key)) {
        PerfTblValue zero_value = {0};
        hmput(tbl->buf, key, zero_value);
    }

    PerfTblValue *v = NULL;
    {
        PerfTblEntry *t = hmgetp(tbl->buf, key);
        assert(t);
        if (t) {
            v = &t->value;
        }
    }

    if (!v) {
        return;
    }

    int32_t i = 0;
    for (i = 0; i < v->num_runs; i++) {
        if (0 == strcmp(run->solver_name, v->runs[i].solver_name)) {
            // Need to update previous perf
            // BUT... This is an invalid case to happen
            assert(0);
            break;
        }
    }

    if (i == v->num_runs && (v->num_runs < ARRAY_LEN_i32(v->runs))) {
        v->num_runs++;
    } else {
        assert(0);
    }

    if (i < v->num_runs) {
        memcpy(&v->runs[i], run, MIN(sizeof(v->runs[i]), sizeof(*run)));
    } else {
        log_fatal("Bad internal error. Too much solvers specified in the same "
                  "batch, or internal bug!!");
        assert(0);
        abort();
    }
}